

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::InputFile::rawTileData
          (InputFile *this,int *dx,int *dy,int *lx,int *ly,char **pixelData,int *pixelDataSize)

{
  ArgExc *this_00;
  long in_RDI;
  stringstream _iex_replace_s;
  char **in_stack_00000058;
  int *in_stack_00000060;
  int *in_stack_00000068;
  int *in_stack_00000070;
  int *in_stack_00000078;
  TiledInputFile *in_stack_00000080;
  int *in_stack_00000090;
  BaseExc *e;
  
  if ((*(byte *)(*(long *)(in_RDI + 8) + 100) & 1) == 0) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,"Tried to read a raw tile from a scanline-based image.");
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  TiledInputFile::rawTileData
            (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
             in_stack_00000060,in_stack_00000058,in_stack_00000090);
  return;
}

Assistant:

void
InputFile::rawTileData (int &dx, int &dy,
			int &lx, int &ly,
			const char *&pixelData,
			int &pixelDataSize)
{
    try
    {
	if (!_data->isTiled)
	{
	    throw IEX_NAMESPACE::ArgExc ("Tried to read a raw tile "
			       "from a scanline-based image.");
	}
        
        _data->tFile->rawTileData (dx, dy, lx, ly, pixelData, pixelDataSize);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error reading tile data from image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}